

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# high_register_operations.c
# Opt level: O0

void high_register_operations(arm7tdmi_t *state,thumbinstr_t *thminstr)

{
  uint uVar1;
  status_register_t *psVar3;
  ushort *in_RSI;
  arm7tdmi_t *in_RDI;
  _Bool thumb;
  uint32_t newpc;
  uint32_t source_data;
  int adj_rs_2;
  int adj_rd_2;
  uint32_t result_1;
  uint32_t rddata_1;
  uint32_t rsdata_1;
  int adj_rs_1;
  int adj_rd_1;
  uint32_t result;
  uint32_t rddata;
  uint32_t rsdata;
  int adj_rs;
  int adj_rd;
  high_register_operations_t *instr;
  uint32_t value_6;
  uint32_t value_5;
  uint32_t value_4;
  uint32_t value_3;
  uint32_t value_2;
  uint32_t value_1;
  uint32_t value;
  status_register_t *psr;
  uint32_t in_stack_fffffffffffffd1c;
  arm7tdmi_t *in_stack_fffffffffffffd20;
  uint local_2a0;
  uint local_29c;
  uint local_278;
  uint local_274;
  uint local_240;
  uint local_23c;
  uint32_t local_228;
  uint local_224;
  uint local_204;
  uint32_t local_1d8;
  uint32_t local_1c8;
  uint32_t local_1b8;
  uint32_t local_1a8;
  uint32_t local_198;
  uint32_t local_188;
  uint32_t local_178;
  uint32_t local_10c;
  uint32_t local_fc;
  uint32_t local_ec;
  uint32_t local_dc;
  uint32_t local_cc;
  uint32_t local_bc;
  uint32_t local_ac;
  uint32_t local_9c;
  uint32_t local_8c;
  uint32_t local_7c;
  uint32_t local_6c;
  uint32_t local_5c;
  uint32_t local_4c;
  uint32_t local_40;
  uint uVar2;
  
  if (((*in_RSI >> 7 & 1) == 0) && ((*in_RSI >> 6 & 1) == 0)) {
    if ((*in_RSI >> 8 & 3) == 0) {
      fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
              "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/arm7tdmi/thumb_instr/high_register_operations.c"
              ,6);
      fprintf(_stderr,"UNIMPLEMENTED CASE DETECTED: %s\n\x1b[0;m","Invalid flag combination!");
      exit(1);
    }
    if ((*in_RSI >> 8 & 3) == 1) {
      fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
              "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/arm7tdmi/thumb_instr/high_register_operations.c"
              ,7);
      fprintf(_stderr,"UNIMPLEMENTED CASE DETECTED: %s\n\x1b[0;m","Invalid flag combination!");
      exit(1);
    }
    if ((*in_RSI >> 8 & 3) == 2) {
      fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
              "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/arm7tdmi/thumb_instr/high_register_operations.c"
              ,8);
      fprintf(_stderr,"UNIMPLEMENTED CASE DETECTED: %s\n\x1b[0;m","Invalid flag combination!");
      exit(1);
    }
  }
  switch(*(byte *)((long)in_RSI + 1) & 3) {
  case 0:
    if ((*in_RSI >> 7 & 1) == 0) {
      local_23c = (uint)(*in_RSI & 7);
    }
    else {
      local_23c = (*in_RSI & 7) + 8;
    }
    if ((*in_RSI >> 6 & 1) == 0) {
      local_240 = (uint)(*in_RSI >> 3 & 7);
    }
    else {
      local_240 = (*in_RSI >> 3 & 7) + 8;
    }
    if (((((in_RDI->cpsr).raw & 0x1f) == 0x11) && (7 < local_240)) && (local_240 < 0xd)) {
      local_178 = in_RDI->highreg_fiq[local_240 - 8];
    }
    else if (local_240 < 0xd) {
      local_178 = in_RDI->r[local_240];
    }
    else if (local_240 == 0xd) {
      switch((in_RDI->cpsr).raw & 0x1f) {
      case 0x11:
        local_10c = in_RDI->sp_fiq;
        break;
      case 0x12:
        local_10c = in_RDI->sp_irq;
        break;
      case 0x13:
        local_10c = in_RDI->sp_svc;
        break;
      default:
        local_10c = in_RDI->sp;
        break;
      case 0x17:
        local_10c = in_RDI->sp_abt;
        break;
      case 0x1b:
        local_10c = in_RDI->sp_und;
      }
      local_178 = local_10c;
    }
    else if (local_240 == 0xe) {
      switch((in_RDI->cpsr).raw & 0x1f) {
      case 0x11:
        local_9c = in_RDI->lr_fiq;
        break;
      case 0x12:
        local_9c = in_RDI->lr_irq;
        break;
      case 0x13:
        local_9c = in_RDI->lr_svc;
        break;
      default:
        local_9c = in_RDI->lr;
        break;
      case 0x17:
        local_9c = in_RDI->lr_abt;
        break;
      case 0x1b:
        local_9c = in_RDI->lr_und;
      }
      local_178 = local_9c;
    }
    else {
      if (local_240 != 0xf) {
        fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/arm7tdmi/thumb_instr/../arm7tdmi.h"
                ,0xa4);
        fprintf(_stderr,"Attempted to read unknown register: r%d\n\x1b[0;m",(ulong)local_240);
        exit(1);
      }
      local_178 = in_RDI->pc;
    }
    if (((((in_RDI->cpsr).raw & 0x1f) == 0x11) && (7 < local_23c)) && (local_23c < 0xd)) {
      local_188 = in_RDI->highreg_fiq[local_23c - 8];
    }
    else if (local_23c < 0xd) {
      local_188 = in_RDI->r[local_23c];
    }
    else if (local_23c == 0xd) {
      switch((in_RDI->cpsr).raw & 0x1f) {
      case 0x11:
        local_fc = in_RDI->sp_fiq;
        break;
      case 0x12:
        local_fc = in_RDI->sp_irq;
        break;
      case 0x13:
        local_fc = in_RDI->sp_svc;
        break;
      default:
        local_fc = in_RDI->sp;
        break;
      case 0x17:
        local_fc = in_RDI->sp_abt;
        break;
      case 0x1b:
        local_fc = in_RDI->sp_und;
      }
      local_188 = local_fc;
    }
    else if (local_23c == 0xe) {
      switch((in_RDI->cpsr).raw & 0x1f) {
      case 0x11:
        local_8c = in_RDI->lr_fiq;
        break;
      case 0x12:
        local_8c = in_RDI->lr_irq;
        break;
      case 0x13:
        local_8c = in_RDI->lr_svc;
        break;
      default:
        local_8c = in_RDI->lr;
        break;
      case 0x17:
        local_8c = in_RDI->lr_abt;
        break;
      case 0x1b:
        local_8c = in_RDI->lr_und;
      }
      local_188 = local_8c;
    }
    else {
      if (local_23c != 0xf) {
        fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/arm7tdmi/thumb_instr/../arm7tdmi.h"
                ,0xa4);
        fprintf(_stderr,"Attempted to read unknown register: r%d\n\x1b[0;m",(ulong)local_23c);
        exit(1);
      }
      local_188 = in_RDI->pc;
    }
    local_204 = local_178 + local_188;
    if (local_23c == 0xf) {
      local_204 = local_204 | 1;
    }
    if (2 < gba_log_verbosity) {
      printf("[DEBUG] Set r%d to 0x%08X\n",(ulong)local_23c,(ulong)local_204);
    }
    if (((((in_RDI->cpsr).raw & 0x1f) == 0x11) && (7 < local_23c)) && (local_23c < 0xd)) {
      in_RDI->highreg_fiq[local_23c - 8] = local_204;
    }
    else if (local_23c < 0xd) {
      in_RDI->r[local_23c] = local_204;
    }
    else if (local_23c == 0xd) {
      switch((in_RDI->cpsr).raw & 0x1f) {
      case 0x11:
        in_RDI->sp_fiq = local_204;
        break;
      case 0x12:
        in_RDI->sp_irq = local_204;
        break;
      case 0x13:
        in_RDI->sp_svc = local_204;
        break;
      default:
        in_RDI->sp = local_204;
        break;
      case 0x17:
        in_RDI->sp_abt = local_204;
        break;
      case 0x1b:
        in_RDI->sp_und = local_204;
      }
    }
    else if (local_23c == 0xe) {
      switch((in_RDI->cpsr).raw & 0x1f) {
      case 0x11:
        in_RDI->lr_fiq = local_204;
        break;
      case 0x12:
        in_RDI->lr_irq = local_204;
        break;
      case 0x13:
        in_RDI->lr_svc = local_204;
        break;
      default:
        in_RDI->lr = local_204;
        break;
      case 0x17:
        in_RDI->lr_abt = local_204;
        break;
      case 0x1b:
        in_RDI->lr_und = local_204;
      }
    }
    else {
      if (local_23c != 0xf) {
        fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/arm7tdmi/thumb_instr/../arm7tdmi.h"
                ,0xeb);
        fprintf(_stderr,"Attempted to write unknown register: r%d\n\x1b[0;m",(ulong)local_23c);
        exit(1);
      }
      if (((in_RDI->cpsr).raw >> 5 & 1) == 0) {
        set_pc(in_stack_fffffffffffffd20,in_stack_fffffffffffffd1c);
      }
      else {
        set_pc(in_stack_fffffffffffffd20,in_stack_fffffffffffffd1c);
      }
    }
    break;
  case 1:
    if ((*in_RSI >> 7 & 1) == 0) {
      local_274 = (uint)(*in_RSI & 7);
    }
    else {
      local_274 = (*in_RSI & 7) + 8;
    }
    if ((*in_RSI >> 6 & 1) == 0) {
      local_278 = (uint)(*in_RSI >> 3 & 7);
    }
    else {
      local_278 = (*in_RSI >> 3 & 7) + 8;
    }
    if (((((in_RDI->cpsr).raw & 0x1f) == 0x11) && (7 < local_278)) && (local_278 < 0xd)) {
      local_198 = in_RDI->highreg_fiq[local_278 - 8];
    }
    else if (local_278 < 0xd) {
      local_198 = in_RDI->r[local_278];
    }
    else if (local_278 == 0xd) {
      switch((in_RDI->cpsr).raw & 0x1f) {
      case 0x11:
        local_ec = in_RDI->sp_fiq;
        break;
      case 0x12:
        local_ec = in_RDI->sp_irq;
        break;
      case 0x13:
        local_ec = in_RDI->sp_svc;
        break;
      default:
        local_ec = in_RDI->sp;
        break;
      case 0x17:
        local_ec = in_RDI->sp_abt;
        break;
      case 0x1b:
        local_ec = in_RDI->sp_und;
      }
      local_198 = local_ec;
    }
    else if (local_278 == 0xe) {
      switch((in_RDI->cpsr).raw & 0x1f) {
      case 0x11:
        local_7c = in_RDI->lr_fiq;
        break;
      case 0x12:
        local_7c = in_RDI->lr_irq;
        break;
      case 0x13:
        local_7c = in_RDI->lr_svc;
        break;
      default:
        local_7c = in_RDI->lr;
        break;
      case 0x17:
        local_7c = in_RDI->lr_abt;
        break;
      case 0x1b:
        local_7c = in_RDI->lr_und;
      }
      local_198 = local_7c;
    }
    else {
      if (local_278 != 0xf) {
        fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/arm7tdmi/thumb_instr/../arm7tdmi.h"
                ,0xa4);
        fprintf(_stderr,"Attempted to read unknown register: r%d\n\x1b[0;m",(ulong)local_278);
        exit(1);
      }
      local_198 = in_RDI->pc;
    }
    if (((((in_RDI->cpsr).raw & 0x1f) == 0x11) && (7 < local_274)) && (local_274 < 0xd)) {
      local_1a8 = in_RDI->highreg_fiq[local_274 - 8];
    }
    else if (local_274 < 0xd) {
      local_1a8 = in_RDI->r[local_274];
    }
    else if (local_274 == 0xd) {
      switch((in_RDI->cpsr).raw & 0x1f) {
      case 0x11:
        local_dc = in_RDI->sp_fiq;
        break;
      case 0x12:
        local_dc = in_RDI->sp_irq;
        break;
      case 0x13:
        local_dc = in_RDI->sp_svc;
        break;
      default:
        local_dc = in_RDI->sp;
        break;
      case 0x17:
        local_dc = in_RDI->sp_abt;
        break;
      case 0x1b:
        local_dc = in_RDI->sp_und;
      }
      local_1a8 = local_dc;
    }
    else if (local_274 == 0xe) {
      switch((in_RDI->cpsr).raw & 0x1f) {
      case 0x11:
        local_6c = in_RDI->lr_fiq;
        break;
      case 0x12:
        local_6c = in_RDI->lr_irq;
        break;
      case 0x13:
        local_6c = in_RDI->lr_svc;
        break;
      default:
        local_6c = in_RDI->lr;
        break;
      case 0x17:
        local_6c = in_RDI->lr_abt;
        break;
      case 0x1b:
        local_6c = in_RDI->lr_und;
      }
      local_1a8 = local_6c;
    }
    else {
      if (local_274 != 0xf) {
        fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/arm7tdmi/thumb_instr/../arm7tdmi.h"
                ,0xa4);
        fprintf(_stderr,"Attempted to read unknown register: r%d\n\x1b[0;m",(ulong)local_274);
        exit(1);
      }
      local_1a8 = in_RDI->pc;
    }
    uVar1 = local_1a8 - local_198;
    (in_RDI->cpsr).raw = (in_RDI->cpsr).raw & 0xdfffffff | (uint)(local_198 <= local_1a8) << 0x1d;
    (in_RDI->cpsr).raw =
         (in_RDI->cpsr).raw & 0xefffffff |
         (uint)((int)((local_1a8 ^ local_198) & (local_198 ^ 0xffffffff ^ uVar1)) < 0) << 0x1c;
    psVar3 = get_psr(in_RDI);
    psVar3->raw = psVar3->raw & 0xbfffffff | (uint)(uVar1 == 0) << 0x1e;
    psVar3->raw = psVar3->raw & 0x7fffffff | (uint)((int)uVar1 < 0) << 0x1f;
    break;
  case 2:
    if ((*in_RSI >> 7 & 1) == 0) {
      local_29c = (uint)(*in_RSI & 7);
    }
    else {
      local_29c = (*in_RSI & 7) + 8;
    }
    if ((*in_RSI >> 6 & 1) == 0) {
      local_2a0 = (uint)(*in_RSI >> 3 & 7);
    }
    else {
      local_2a0 = (*in_RSI >> 3 & 7) + 8;
    }
    if (((((in_RDI->cpsr).raw & 0x1f) == 0x11) && (7 < local_2a0)) && (local_2a0 < 0xd)) {
      local_1b8 = in_RDI->highreg_fiq[local_2a0 - 8];
    }
    else if (local_2a0 < 0xd) {
      local_1b8 = in_RDI->r[local_2a0];
    }
    else if (local_2a0 == 0xd) {
      switch((in_RDI->cpsr).raw & 0x1f) {
      case 0x11:
        local_cc = in_RDI->sp_fiq;
        break;
      case 0x12:
        local_cc = in_RDI->sp_irq;
        break;
      case 0x13:
        local_cc = in_RDI->sp_svc;
        break;
      default:
        local_cc = in_RDI->sp;
        break;
      case 0x17:
        local_cc = in_RDI->sp_abt;
        break;
      case 0x1b:
        local_cc = in_RDI->sp_und;
      }
      local_1b8 = local_cc;
    }
    else if (local_2a0 == 0xe) {
      switch((in_RDI->cpsr).raw & 0x1f) {
      case 0x11:
        local_5c = in_RDI->lr_fiq;
        break;
      case 0x12:
        local_5c = in_RDI->lr_irq;
        break;
      case 0x13:
        local_5c = in_RDI->lr_svc;
        break;
      default:
        local_5c = in_RDI->lr;
        break;
      case 0x17:
        local_5c = in_RDI->lr_abt;
        break;
      case 0x1b:
        local_5c = in_RDI->lr_und;
      }
      local_1b8 = local_5c;
    }
    else {
      if (local_2a0 != 0xf) {
        fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/arm7tdmi/thumb_instr/../arm7tdmi.h"
                ,0xa4);
        fprintf(_stderr,"Attempted to read unknown register: r%d\n\x1b[0;m",(ulong)local_2a0);
        exit(1);
      }
      local_1b8 = in_RDI->pc;
    }
    local_224 = local_1b8;
    if (local_29c == 0xf) {
      local_224 = local_1b8 | 1;
    }
    if (2 < gba_log_verbosity) {
      printf("[DEBUG] Set r%d to 0x%08X\n",(ulong)local_29c,(ulong)local_224);
    }
    if (((((in_RDI->cpsr).raw & 0x1f) == 0x11) && (7 < local_29c)) && (local_29c < 0xd)) {
      in_RDI->highreg_fiq[local_29c - 8] = local_224;
    }
    else if (local_29c < 0xd) {
      in_RDI->r[local_29c] = local_224;
    }
    else if (local_29c == 0xd) {
      switch((in_RDI->cpsr).raw & 0x1f) {
      case 0x11:
        in_RDI->sp_fiq = local_224;
        break;
      case 0x12:
        in_RDI->sp_irq = local_224;
        break;
      case 0x13:
        in_RDI->sp_svc = local_224;
        break;
      default:
        in_RDI->sp = local_224;
        break;
      case 0x17:
        in_RDI->sp_abt = local_224;
        break;
      case 0x1b:
        in_RDI->sp_und = local_224;
      }
    }
    else if (local_29c == 0xe) {
      switch((in_RDI->cpsr).raw & 0x1f) {
      case 0x11:
        in_RDI->lr_fiq = local_224;
        break;
      case 0x12:
        in_RDI->lr_irq = local_224;
        break;
      case 0x13:
        in_RDI->lr_svc = local_224;
        break;
      default:
        in_RDI->lr = local_224;
        break;
      case 0x17:
        in_RDI->lr_abt = local_224;
        break;
      case 0x1b:
        in_RDI->lr_und = local_224;
      }
    }
    else {
      if (local_29c != 0xf) {
        fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/arm7tdmi/thumb_instr/../arm7tdmi.h"
                ,0xeb);
        fprintf(_stderr,"Attempted to write unknown register: r%d\n\x1b[0;m",(ulong)local_29c);
        exit(1);
      }
      if (((in_RDI->cpsr).raw >> 5 & 1) == 0) {
        set_pc(in_stack_fffffffffffffd20,in_stack_fffffffffffffd1c);
      }
      else {
        set_pc(in_stack_fffffffffffffd20,in_stack_fffffffffffffd1c);
      }
    }
    break;
  case 3:
    if (((byte)(*in_RSI >> 7) & 1) == 1) {
      fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
              "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/arm7tdmi/thumb_instr/high_register_operations.c"
              ,0x2c);
      fprintf(_stderr,"UNIMPLEMENTED CASE DETECTED: %s\n\x1b[0;m","INVALID setting for h1");
      exit(1);
    }
    if ((*in_RSI >> 6 & 1) == 0) {
      uVar1 = (uint)(*in_RSI >> 3 & 7);
      if (((((in_RDI->cpsr).raw & 0x1f) == 0x11) && (7 < uVar1)) && (uVar1 < 0xd)) {
        local_1d8 = in_RDI->highreg_fiq[uVar1 - 8];
      }
      else if (uVar1 < 0xd) {
        local_1d8 = in_RDI->r[uVar1];
      }
      else if (uVar1 == 0xd) {
        switch((in_RDI->cpsr).raw & 0x1f) {
        case 0x11:
          local_ac = in_RDI->sp_fiq;
          break;
        case 0x12:
          local_ac = in_RDI->sp_irq;
          break;
        case 0x13:
          local_ac = in_RDI->sp_svc;
          break;
        default:
          local_ac = in_RDI->sp;
          break;
        case 0x17:
          local_ac = in_RDI->sp_abt;
          break;
        case 0x1b:
          local_ac = in_RDI->sp_und;
        }
        local_1d8 = local_ac;
      }
      else if (uVar1 == 0xe) {
        in_stack_fffffffffffffd20 = (arm7tdmi_t *)(ulong)(((in_RDI->cpsr).raw & 0x1f) - 0x11);
        switch(in_stack_fffffffffffffd20) {
        case (arm7tdmi_t *)0x0:
          local_40 = in_RDI->lr_fiq;
          break;
        case (arm7tdmi_t *)0x1:
          local_40 = in_RDI->lr_irq;
          break;
        case (arm7tdmi_t *)0x2:
          local_40 = in_RDI->lr_svc;
          break;
        default:
          local_40 = in_RDI->lr;
          break;
        case (arm7tdmi_t *)0x6:
          local_40 = in_RDI->lr_abt;
          break;
        case (arm7tdmi_t *)0xa:
          local_40 = in_RDI->lr_und;
        }
        local_1d8 = local_40;
      }
      else {
        if (uVar1 != 0xf) {
          fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                  "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/arm7tdmi/thumb_instr/../arm7tdmi.h"
                  ,0xa4);
          fprintf(_stderr,"Attempted to read unknown register: r%d\n\x1b[0;m",(ulong)uVar1);
          exit(1);
        }
        local_1d8 = in_RDI->pc;
      }
      local_228 = local_1d8;
    }
    else {
      uVar2 = (uint)(*in_RSI >> 3 & 7);
      uVar1 = uVar2 + 8;
      if (((((in_RDI->cpsr).raw & 0x1f) == 0x11) && (7 < uVar1)) && (uVar1 < 0xd)) {
        local_1c8 = in_RDI->highreg_fiq[uVar2];
      }
      else if (uVar1 < 0xd) {
        local_1c8 = in_RDI->r[uVar1];
      }
      else if (uVar1 == 0xd) {
        switch((in_RDI->cpsr).raw & 0x1f) {
        case 0x11:
          local_bc = in_RDI->sp_fiq;
          break;
        case 0x12:
          local_bc = in_RDI->sp_irq;
          break;
        case 0x13:
          local_bc = in_RDI->sp_svc;
          break;
        default:
          local_bc = in_RDI->sp;
          break;
        case 0x17:
          local_bc = in_RDI->sp_abt;
          break;
        case 0x1b:
          local_bc = in_RDI->sp_und;
        }
        local_1c8 = local_bc;
      }
      else if (uVar1 == 0xe) {
        switch((in_RDI->cpsr).raw & 0x1f) {
        case 0x11:
          local_4c = in_RDI->lr_fiq;
          break;
        case 0x12:
          local_4c = in_RDI->lr_irq;
          break;
        case 0x13:
          local_4c = in_RDI->lr_svc;
          break;
        default:
          local_4c = in_RDI->lr;
          break;
        case 0x17:
          local_4c = in_RDI->lr_abt;
          break;
        case 0x1b:
          local_4c = in_RDI->lr_und;
        }
        local_1c8 = local_4c;
      }
      else {
        if (uVar1 != 0xf) {
          fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                  "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/arm7tdmi/thumb_instr/../arm7tdmi.h"
                  ,0xa4);
          fprintf(_stderr,"Attempted to read unknown register: r%d\n\x1b[0;m",(ulong)uVar1);
          exit(1);
        }
        local_1c8 = in_RDI->pc;
      }
      local_228 = local_1c8;
    }
    if (1 < gba_log_verbosity) {
      printf("\x1b[0;36m[INFO]  Hold on to your (high register operations) hats, we\'re jumping to 0x%02X\n\x1b[0;m"
             ,(ulong)local_228);
    }
    if (((local_228 & 1) == 0) && (2 < gba_log_verbosity)) {
      printf("[DEBUG] REALLY hang on, we\'re exiting THUMB mode!\n");
    }
    set_pc(in_stack_fffffffffffffd20,in_stack_fffffffffffffd1c);
  }
  return;
}

Assistant:

void high_register_operations(arm7tdmi_t* state, thumbinstr_t* thminstr) {
    high_register_operations_t* instr = &thminstr->HIGH_REGISTER_OPERATIONS;
    if (instr->h1 == 0 && instr->h2 == 0) {
        unimplemented(instr->opcode == 0b00, "Invalid flag combination!")
        unimplemented(instr->opcode == 0b01, "Invalid flag combination!")
        unimplemented(instr->opcode == 0b10, "Invalid flag combination!")
    }
    switch (instr->opcode) {
        case 0b00: { // ADD
            int adj_rd = instr->h1 ? instr->rdhd + 8 : instr->rdhd;
            int adj_rs = instr->h2 ? instr->rshs + 8 : instr->rshs;
            word rsdata = get_register(state, adj_rs);
            word rddata = get_register(state, adj_rd);
            word result = rsdata + rddata;
            if (adj_rd == REG_PC) {
                result |= 1; // Set thumb mode bit
            }
            set_register(state, adj_rd, result);
            break;
        }
        case 0b01: { // CMP (only one that sets condition codes in this group)
            int adj_rd = instr->h1 ? instr->rdhd + 8 : instr->rdhd;
            int adj_rs = instr->h2 ? instr->rshs + 8 : instr->rshs;
            word rsdata = get_register(state, adj_rs);
            word rddata = get_register(state, adj_rd);
            word result = rddata - rsdata;
            set_flags_sub(state, rddata, rsdata, result);
            set_flags_nz(state, result);
            break;
        }
        case 0b10: { // MOV
            int adj_rd = instr->h1 ? instr->rdhd + 8 : instr->rdhd;
            int adj_rs = instr->h2 ? instr->rshs + 8 : instr->rshs;
            word source_data = get_register(state, adj_rs);
            if (adj_rd == REG_PC) {
                source_data |= 1; // Set thumb mode bit
            }
            set_register(state, adj_rd, source_data);
            break;
        }
        case 0b11: { // BX
            unimplemented(instr->h1 == 1, "INVALID setting for h1")
            word newpc;
            if (instr->h2) {
                newpc = get_register(state, instr->rshs + 8);
            } else {
                newpc = get_register(state, instr->rshs);
            }

            bool thumb = newpc & 1u;
            loginfo("Hold on to your (high register operations) hats, we're jumping to 0x%02X", newpc)
            if (!thumb) logdebug("REALLY hang on, we're exiting THUMB mode!")
            set_pc(state, newpc);
            break;
        }
    }
}